

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

BasicHandleInfo * __thiscall
helics::HandleManager::addHandle
          (HandleManager *this,GlobalFederateId fed_id,InterfaceHandle param_2,InterfaceType what,
          string_view key,string_view type,string_view units)

{
  size_type sVar1;
  _Elt_pointer pBVar2;
  string actKey;
  InterfaceType local_6a;
  allocator<char> local_69;
  InterfaceHandle local_68;
  GlobalFederateId local_64;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string local_50;
  
  local_60._M_str = key._M_str;
  local_6a = what;
  local_68.hid = param_2.hid;
  local_64.gid = fed_id.gid;
  local_60._M_len = key._M_len;
  sVar1 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::size
                    (&this->handles);
  if (key._M_len == 0) {
    generateName_abi_cxx11_(&local_50,this,what);
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_50,&local_60,&local_69);
  }
  std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>::
  emplace_back<helics::GlobalFederateId&,helics::InterfaceHandle&,helics::InterfaceType&,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>> *)this,
             &local_64,&local_68,&local_6a,&local_50,&type,&units);
  pBVar2 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar2 == (this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pBVar2 = (this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  addSearchFields(this,pBVar2 + -1,(int32_t)sVar1);
  pBVar2 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar2 == (this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pBVar2 = (this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  std::__cxx11::string::~string((string *)&local_50);
  return pBVar2 + -1;
}

Assistant:

BasicHandleInfo& HandleManager::addHandle(GlobalFederateId fed_id,
                                          InterfaceHandle local_id,
                                          InterfaceType what,
                                          std::string_view key,
                                          std::string_view type,
                                          std::string_view units)
{
    auto index = static_cast<int32_t>(handles.size());
    const std::string actKey = (!key.empty()) ? std::string{key} : generateName(what);
    handles.emplace_back(fed_id, local_id, what, actKey, type, units);
    addSearchFields(handles.back(), index);
    return handles.back();
}